

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

void set_pit_type(wchar_t depth,wchar_t type)

{
  pit_profile *ppVar1;
  int16_t iVar2;
  int iVar3;
  uint32_t uVar4;
  wchar_t local_34;
  pit_profile *pit;
  wchar_t dist;
  wchar_t offset;
  wchar_t pit_dist;
  wchar_t pit_idx;
  wchar_t i;
  wchar_t type_local;
  wchar_t depth_local;
  
  offset = L'\0';
  dist = L'ϧ';
  for (pit_dist = L'\0'; ppVar1 = pit_info, pit_dist < (int)(uint)z_info->pit_max;
      pit_dist = pit_dist + L'\x01') {
    if ((type == L'\0') ||
       ((pit_info[pit_dist].name != (char *)0x0 && (pit_info[pit_dist].room_type == type)))) {
      iVar2 = Rand_normal(pit_info[pit_dist].ave,10);
      iVar3 = (int)iVar2;
      if (iVar3 - depth < 0) {
        local_34 = -(iVar3 - depth);
      }
      else {
        local_34 = iVar3 - depth;
      }
      if ((local_34 < dist) && (uVar4 = Rand_div(ppVar1[pit_dist].rarity), uVar4 == 0)) {
        offset = pit_dist;
        dist = local_34;
      }
    }
  }
  dun->pit_type = pit_info + offset;
  return;
}

Assistant:

void set_pit_type(int depth, int type)
{
	int i;
	int pit_idx = 0;

	/* Hack -- set initial distance large */
	int pit_dist = 999;

	for (i = 0; i < z_info->pit_max; i++) {
		int offset, dist;
		struct pit_profile *pit = &pit_info[i];

		/* Skip empty pits or pits of the wrong room type */
		if (type && (!pit->name || pit->room_type != type)) continue;

		offset = Rand_normal(pit->ave, 10);
		dist = ABS(offset - depth);

		if (dist < pit_dist && one_in_(pit->rarity)) {
			/* This pit is the closest so far */
			pit_idx = i;
			pit_dist = dist;
		}
	}

	dun->pit_type = &pit_info[pit_idx];
}